

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

void secp256k1_fe_inv_var(secp256k1_fe *r,secp256k1_fe *x)

{
  int iVar1;
  int iVar2;
  secp256k1_fe *in_RSI;
  long in_RDI;
  int input_is_zero;
  secp256k1_fe *in_stack_00000038;
  secp256k1_fe *in_stack_00000040;
  
  iVar1 = secp256k1_fe_normalizes_to_zero((secp256k1_fe *)0x135178);
  secp256k1_fe_verify(in_RSI);
  secp256k1_fe_impl_inv_var(in_stack_00000040,in_stack_00000038);
  *(uint *)(in_RDI + 0x28) = (uint)(0 < in_RSI->magnitude);
  *(undefined4 *)(in_RDI + 0x2c) = 1;
  iVar2 = secp256k1_fe_normalizes_to_zero((secp256k1_fe *)0x1351c4);
  if (iVar2 != iVar1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/field_impl.h"
            ,0x19f,"test condition failed: secp256k1_fe_normalizes_to_zero(r) == input_is_zero");
    abort();
  }
  secp256k1_fe_verify(in_RSI);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv_var(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    SECP256K1_FE_VERIFY(x);

    secp256k1_fe_impl_inv_var(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;

    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    SECP256K1_FE_VERIFY(r);
}